

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Array * __thiscall json::Array::add<json::Float,double>(Array *this,double *v)

{
  Float *this_00;
  XPtr<json::Type> local_20;
  double *local_18;
  double *v_local;
  Array *this_local;
  
  local_18 = v;
  v_local = (double *)this;
  this_00 = (Float *)operator_new(0x10);
  Float::Float(this_00,*local_18);
  common::XPtr<json::Type>::XPtr(&local_20,(Type *)this_00);
  std::vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>::
  push_back(&this->fields,&local_20);
  common::XPtr<json::Type>::~XPtr(&local_20);
  return this;
}

Assistant:

Array& add(V const& v) {
            fields.push_back(new T(v));
            return *this;
        }